

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreeAxisForceTorqueContactSensor.cpp
# Opt level: O0

void __thiscall
iDynTree::ThreeAxisForceTorqueContactSensor::ThreeAxisForceTorqueContactSensor
          (ThreeAxisForceTorqueContactSensor *this,ThreeAxisForceTorqueContactSensor *other)

{
  void *pvVar1;
  ThreeAxisForceTorqueContactSensorPrivateAttributes *in_RSI;
  undefined8 *in_RDI;
  LinkSensor *in_stack_ffffffffffffffd0;
  undefined8 *puVar2;
  ThreeAxisForceTorqueContactSensorPrivateAttributes *in_stack_ffffffffffffffe8;
  
  LinkSensor::LinkSensor(in_stack_ffffffffffffffd0);
  *in_RDI = &PTR__ThreeAxisForceTorqueContactSensor_004fab18;
  puVar2 = in_RDI + 1;
  pvVar1 = operator_new(0xc0);
  ThreeAxisForceTorqueContactSensorPrivateAttributes::
  ThreeAxisForceTorqueContactSensorPrivateAttributes(in_RSI,in_stack_ffffffffffffffe8);
  *puVar2 = pvVar1;
  return;
}

Assistant:

ThreeAxisForceTorqueContactSensor::ThreeAxisForceTorqueContactSensor(const ThreeAxisForceTorqueContactSensor& other):
    pimpl(new ThreeAxisForceTorqueContactSensorPrivateAttributes(*(other.pimpl)))
{

}